

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

ssize_t __thiscall directory::write(directory *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char *pcVar2;
  const_reference pvVar3;
  undefined4 in_register_00000034;
  uint local_2c;
  undefined1 auStack_28 [4];
  int i;
  __mbstate_t local_20;
  long local_18;
  fstream *stream_local;
  directory *this_local;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  lVar1 = local_18 + 0x10;
  stream_local = (fstream *)this;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_28,0);
  std::ostream::seekp(lVar1,_auStack_28,local_20);
  std::ostream::write((char *)(local_18 + 0x10),(long)this);
  std::ostream::write((char *)(local_18 + 0x10),(long)&this->bucket_size);
  for (local_2c = 0; local_2c < this->bucket_size; local_2c = local_2c + 1) {
    pcVar2 = (char *)(local_18 + 0x10);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)(int)local_2c);
    std::ostream::write(pcVar2,(long)pvVar3);
  }
  return (ulong)local_2c;
}

Assistant:

void directory::write(std::fstream &stream) const {
    stream.seekp(0);

    stream.write((char *) &depth, DEPTHS);
    stream.write((char *) &bucket_size, BUCKET_SIZE);

    for (int i = 0; i < bucket_size; ++i) {
        stream.write((char *) &bucket_ids[i], BUCKET_ID);
    }
}